

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  XCore_init(MRI);
  *(code **)(ctx + 8) = XCore_printInst;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(MCRegisterInfo **)(ctx + 0x20) = MRI;
  *(code **)(ctx + 0x18) = XCore_getInstruction;
  *(code **)(ctx + 0x50) = XCore_post_printer;
  *(code **)(ctx + 0x30) = XCore_reg_name;
  *(code **)(ctx + 0x48) = XCore_get_insn_id;
  *(code **)(ctx + 0x38) = XCore_insn_name;
  *(code **)(ctx + 0x40) = XCore_group_name;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 |
				CS_MODE_MICRO | CS_MODE_MIPS32R6 |
				CS_MODE_MIPSGP64 | CS_MODE_BIG_ENDIAN))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	Mips_init(mri);
	ud->printer = Mips_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->reg_name = Mips_reg_name;
	ud->insn_id = Mips_get_insn_id;
	ud->insn_name = Mips_insn_name;
	ud->group_name = Mips_group_name;

	if (ud->mode & CS_MODE_32 || ud->mode & CS_MODE_MIPS32R6)
		ud->disasm = Mips_getInstruction;
	else
		ud->disasm = Mips64_getInstruction;

	return CS_ERR_OK;
}